

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O3

BinaryQuadraticModel<unsigned_long,_double,_cimod::Sparse> * __thiscall
openjij::graph::json_parse<double,cimod::Sparse>
          (BinaryQuadraticModel<unsigned_long,_double,_cimod::Sparse> *__return_storage_ptr__,
          graph *this,json *obj,bool relabel)

{
  undefined1 auVar1 [16];
  reference pvVar2;
  undefined7 in_register_00000009;
  ulong uVar3;
  pointer puVar4;
  pointer puVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  json temp;
  BinaryQuadraticModel<unsigned_long,_double,_cimod::Sparse> bqm;
  Vartype local_f4;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_d0;
  BinaryQuadraticModel<unsigned_long,_double,_cimod::Sparse> local_c0;
  long lVar8;
  
  puVar4 = (pointer)CONCAT71(in_register_00000009,relabel);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_f0,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)this);
  local_d0.m_type = null;
  local_d0.m_value.object = (object_t *)0x0;
  nlohmann::json_abi_v3_11_2::detail::
  external_constructor<(nlohmann::json_abi_v3_11_2::detail::value_t)3>::
  construct<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char[21],_0>
            (&local_d0,(char (*) [21])"BinaryQuadraticModel");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_d0,true);
  pvVar2 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)&local_f0,"type");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(pvVar2,&local_d0);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_d0);
  if ((char)obj != '\0') {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)&local_f0,"num_variables");
    local_c0._quadmat._0_8_ = (pointer)0x0;
    nlohmann::json_abi_v3_11_2::detail::
    get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_long,_0>
              (pvVar2,(unsigned_long *)&local_c0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c0,
               local_c0._quadmat._0_8_,(allocator_type *)&local_f4);
    auVar1 = _DAT_001d8020;
    puVar4 = (pointer)local_c0._quadmat.m_outerSize;
    if (local_c0._quadmat._0_8_ != local_c0._quadmat.m_outerSize) {
      uVar3 = local_c0._quadmat.m_outerSize + (-8 - local_c0._quadmat._0_8_);
      puVar4 = (pointer)((uVar3 >> 3) + 2 & 0xfffffffffffffffe);
      auVar9._8_4_ = (int)uVar3;
      auVar9._0_8_ = uVar3;
      auVar9._12_4_ = (int)(uVar3 >> 0x20);
      auVar6._0_8_ = uVar3 >> 3;
      auVar6._8_8_ = auVar9._8_8_ >> 3;
      puVar5 = (pointer)0x0;
      auVar6 = auVar6 ^ _DAT_001d8020;
      auVar7 = _DAT_001d8010;
      do {
        auVar9 = auVar7 ^ auVar1;
        if ((bool)(~(auVar9._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar9._0_4_ ||
                    auVar6._4_4_ < auVar9._4_4_) & 1)) {
          *(pointer *)(local_c0._quadmat._0_8_ + puVar5 * 8) = puVar5;
        }
        if ((auVar9._12_4_ != auVar6._12_4_ || auVar9._8_4_ <= auVar6._8_4_) &&
            auVar9._12_4_ <= auVar6._12_4_) {
          *(ulong *)(local_c0._quadmat._0_8_ + ((long)puVar5 + 1) * 8) = (long)puVar5 + 1;
        }
        puVar5 = (pointer)((long)puVar5 + 2);
        lVar8 = auVar7._8_8_;
        auVar7._0_8_ = auVar7._0_8_ + 2;
        auVar7._8_8_ = lVar8 + 2;
      } while (puVar4 != puVar5);
    }
    local_e0.m_type = null;
    local_e0.m_value.object = (object_t *)0x0;
    nlohmann::json_abi_v3_11_2::detail::
    external_constructor<(nlohmann::json_abi_v3_11_2::detail::value_t)2>::
    construct<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_0>
              (&local_e0,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c0);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_e0,true);
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)&local_f0,"variable_labels");
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator=(pvVar2,&local_e0);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_e0);
    if ((pointer)local_c0._quadmat._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_c0._quadmat._0_8_,
                      local_c0._quadmat.m_innerSize - local_c0._quadmat._0_8_);
    }
  }
  cimod::BinaryQuadraticModel<unsigned_long,double,cimod::Sparse>::
  from_serializable<unsigned_long,double,cimod::Sparse>
            (&local_c0,(BinaryQuadraticModel<unsigned_long,double,cimod::Sparse> *)&local_f0,
             (json *)0x0,puVar4);
  local_f4 = SPIN;
  cimod::BinaryQuadraticModel<unsigned_long,_double,_cimod::Sparse>::change_vartype
            (__return_storage_ptr__,&local_c0,&local_f4,false);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_c0._label_to_idx._M_h);
  if (local_c0._idx_to_label.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0._idx_to_label.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0._idx_to_label.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0._idx_to_label.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  free(local_c0._quadmat.m_outerIndex);
  free(local_c0._quadmat.m_innerNonZeros);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_c0._quadmat.m_data);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_f0);
  return __return_storage_ptr__;
}

Assistant:

inline auto json_parse(const json &obj, bool relabel = true) {

  using namespace cimod;
  // convert variable_labels
  json temp = obj;
  temp["type"] = "BinaryQuadraticModel";
  if (relabel) {
    // re-labeling
    std::size_t num_variables = temp["num_variables"];
    std::vector<size_t> variables(num_variables);
    // generate sequence numbers
    std::iota(variables.begin(), variables.end(), 0);
    temp["variable_labels"] = variables;
  }
  // make cimod object and apply to_serializable function
  auto bqm =
      BinaryQuadraticModel<size_t, FloatType, CimodDataType>::from_serializable(
          temp);
  return bqm.change_vartype(Vartype::SPIN, false);
}